

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SstReader::EndStep(SstReader *this)

{
  int iVar1;
  long *in_RDI;
  SstStatusValue Result;
  ScopedTimer __var2454;
  void *in_stack_fffffffffffffe18;
  SstStream in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  allocator *paVar2;
  SstStream in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe60;
  void *pvVar3;
  int commRank;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  allocator local_161;
  string local_160 [39];
  undefined1 local_139 [40];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [36];
  SstStatusValue local_c4;
  undefined1 local_b1 [40];
  allocator<char> local_89;
  string local_88 [24];
  undefined8 in_stack_ffffffffffffff90;
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [40];
  
  commRank = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  if ((*(byte *)((long)in_RDI + 0x84) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    in_stack_fffffffffffffe80 = (string *)local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_61 + 1),"SstReader",(allocator *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe78 = (string *)&local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"EndStep",(allocator *)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe70 = (string *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_b1 + 1),"EndStep() is called without a successful BeginStep()",
               (allocator *)in_stack_fffffffffffffe70);
    helper::Throw<std::logic_error>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68,commRank);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::~string((string *)(local_61 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  if ((EndStep()::__var454 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&EndStep()::__var454), iVar1 != 0)) {
    in_stack_fffffffffffffe68 =
         (string *)
         ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/sst/SstReader.cpp"
                             ,"virtual void adios2::core::engine::SstReader::EndStep()",0x1c6);
    EndStep::__var454 = (void *)ps_timer_create_(in_stack_fffffffffffffe68);
    pvVar3 = EndStep::__var454;
    __cxa_guard_release(&EndStep()::__var454);
    commRank = (int)((ulong)pvVar3 >> 0x20);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if (((*(byte *)((long)in_RDI + 0x83) & 1) != 0) && ((*(byte *)(in_RDI + 0x1a) & 1) == 0)) {
    SstCurrentStep((SstStream)in_RDI[0x18]);
    SstReaderDefinitionLock(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    *(undefined1 *)(in_RDI + 0x1a) = 1;
  }
  if ((int)in_RDI[0x19] == 0) {
    local_c4 = SstFFSPerformGets(in_stack_fffffffffffffe20);
    if (local_c4 != SstSuccess) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Engine",&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"SstReader",&local_111);
      in_stack_fffffffffffffe30 = (SstStream)local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_139 + 1),"EndStep",(allocator *)in_stack_fffffffffffffe30);
      paVar2 = &local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"Writer failed before returning data",paVar2);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68,commRank);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      std::__cxx11::string::~string((string *)(local_139 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_139);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
  }
  else if ((int)in_RDI[0x19] == 1) {
    (**(code **)(*in_RDI + 0x38))();
    in_stack_fffffffffffffe20 = (SstStream)in_RDI[0x1c];
    if (in_stack_fffffffffffffe20 != (SstStream)0x0) {
      (*(code *)in_stack_fffffffffffffe20->CPInfo->ffs_c)();
    }
  }
  if ((int)in_RDI[0x19] == 2) {
    BP5PerformGets((SstReader *)in_stack_ffffffffffffff90);
  }
  SstReleaseStep(in_stack_fffffffffffffe30);
  std::
  unordered_map<const_adios2::core::VariableBase_*,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>_>_>
  ::clear((unordered_map<const_adios2::core::VariableBase_*,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>_>_>
           *)0xe70349);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffe20);
  return;
}

Assistant:

void SstReader::EndStep()
{
    if (!m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "SstReader", "EndStep",
                                        "EndStep() is called without a successful BeginStep()");
    }
    m_BetweenStepPairs = false;
    PERFSTUBS_SCOPED_TIMER_FUNC();
    if (m_ReaderSelectionsLocked && !m_DefinitionsNotified)
    {
        SstReaderDefinitionLock(m_Input, SstCurrentStep(m_Input));
        m_DefinitionsNotified = true;
    }
    if (m_WriterMarshalMethod == SstMarshalFFS)
    {
        SstStatusValue Result;
        // this does all the deferred gets and fills in the variable array data
        Result = SstFFSPerformGets(m_Input);
        if (Result != SstSuccess)
        {
            // tentative, until we change EndStep so that it has a return value
            helper::Throw<std::runtime_error>("Engine", "SstReader", "EndStep",
                                              "Writer failed before returning data");
        }
    }
    else if (m_WriterMarshalMethod == SstMarshalBP)
    {

        PerformGets();
        //  I'm assuming that the DoGet calls below have been constructing
        //  some kind of data structure that indicates what data this reader
        //  needs from different writers, what read requests it needs to
        //  make, where to put the data when it arrives, etc.  Therefore the
        //  pseudocode here looks like:
        //         IssueReadRequests()   I.E. do calls to SstReadRemoteMemory()
        //         as necessary to get the data coming these are asynchronous
        //	   so that they can happen in parallel.
        //         WaitForReadRequests()   Wait for each of these read requests
        //         to complete.  See the SstWaitForCompletion function.
        //         FillReadRequests()    Given the data that was just read,
        //         place it appropriately into the waiting vars.
        //	   ClearReadRequests()  Clean up as necessary
        //
        delete m_BP3Deserializer;
    }
    if (m_WriterMarshalMethod == SstMarshalBP5)
    {

        BP5PerformGets();
    }
    else
    {
        // unknown marshaling method, shouldn't happen
    }
    SstReleaseStep(m_Input);
    m_InfoMap.clear();
}